

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O2

bool LookupOne(CDBWrapper *db,CBlockIndex *block_index,DBVal *result)

{
  long lVar1;
  bool bVar2;
  long lVar3;
  DBVal *pDVar4;
  long in_FS_OFFSET;
  byte bVar5;
  uint256 local_d8;
  DBHashKey local_b8;
  pair<uint256,_(anonymous_namespace)::DBVal> read_out;
  
  bVar5 = 0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  read_out.second.header.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  read_out.second.hash.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  read_out.first.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  read_out.second.pos.nFile = -1;
  read_out.second.pos.nPos = 0;
  local_b8.hash.super_base_blob<256U>.m_data._M_elems._0_4_ = block_index->nHeight;
  bVar2 = CDBWrapper::
          Read<(anonymous_namespace)::DBHeightKey,std::pair<uint256,(anonymous_namespace)::DBVal>>
                    (db,(DBHeightKey *)&local_b8,&read_out);
  if (bVar2) {
    CBlockIndex::GetBlockHash(&local_b8.hash,block_index);
    bVar2 = operator==((base_blob<256U> *)&read_out,(base_blob<256U> *)&local_b8);
    if (bVar2) {
      pDVar4 = &read_out.second;
      for (lVar3 = 0x12; lVar3 != 0; lVar3 = lVar3 + -1) {
        *(undefined4 *)(result->hash).super_base_blob<256U>.m_data._M_elems =
             *(undefined4 *)(pDVar4->hash).super_base_blob<256U>.m_data._M_elems;
        pDVar4 = (DBVal *)((long)pDVar4 + (ulong)bVar5 * -8 + 4);
        result = (DBVal *)((long)result + (ulong)bVar5 * -8 + 4);
      }
      bVar2 = true;
    }
    else {
      CBlockIndex::GetBlockHash(&local_d8,block_index);
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0x10] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x10];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0x11] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x11];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0x12] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x12];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0x13] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x13];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0x14] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x14];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0x15] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x15];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0x16] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x16];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0x17] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x17];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0x18] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x18];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0x19] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x19];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x1a];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x1b];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x1c];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x1d];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x1e];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0x1f];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[1] =
           local_d8.super_base_blob<256U>.m_data._M_elems[1];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[2] =
           local_d8.super_base_blob<256U>.m_data._M_elems[2];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[3] =
           local_d8.super_base_blob<256U>.m_data._M_elems[3];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[4] =
           local_d8.super_base_blob<256U>.m_data._M_elems[4];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[5] =
           local_d8.super_base_blob<256U>.m_data._M_elems[5];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[6] =
           local_d8.super_base_blob<256U>.m_data._M_elems[6];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[7] =
           local_d8.super_base_blob<256U>.m_data._M_elems[7];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[8] =
           local_d8.super_base_blob<256U>.m_data._M_elems[8];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[9] =
           local_d8.super_base_blob<256U>.m_data._M_elems[9];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[10] =
           local_d8.super_base_blob<256U>.m_data._M_elems[10];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0xb] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0xb];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0xc] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0xc];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0xd] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0xd];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0xe] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0xe];
      local_b8.hash.super_base_blob<256U>.m_data._M_elems[0xf] =
           local_d8.super_base_blob<256U>.m_data._M_elems[0xf];
      bVar2 = CDBWrapper::Read<(anonymous_namespace)::DBHashKey,(anonymous_namespace)::DBVal>
                        (db,&local_b8,result);
    }
  }
  else {
    bVar2 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool LookupOne(const CDBWrapper& db, const CBlockIndex* block_index, DBVal& result)
{
    // First check if the result is stored under the height index and the value there matches the
    // block hash. This should be the case if the block is on the active chain.
    std::pair<uint256, DBVal> read_out;
    if (!db.Read(DBHeightKey(block_index->nHeight), read_out)) {
        return false;
    }
    if (read_out.first == block_index->GetBlockHash()) {
        result = std::move(read_out.second);
        return true;
    }

    // If value at the height index corresponds to an different block, the result will be stored in
    // the hash index.
    return db.Read(DBHashKey(block_index->GetBlockHash()), result);
}